

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_86c9b4::dummy::~dummy(dummy *this)

{
  dummy *this_local;
  
  (anonymous_namespace)::dummy::instances_count = (anonymous_namespace)::dummy::instances_count + -1
  ;
  return;
}

Assistant:

~dummy () noexcept(false)
        {
            if (alive)
            {
                alive = false;
            }
            else
            {
                throw std::runtime_error(u8"Двойное уничтожение!"_u8s);
            }
            --instances_count;
        }